

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-gear.c
# Opt level: O3

void pack_overflow(object *obj)

{
  ushort uVar1;
  loc grid;
  wchar_t wVar2;
  uint uVar3;
  ulong uVar4;
  player_upkeep *ppVar5;
  object *in_RDI;
  bool bVar6;
  char o_name [80];
  object *local_70;
  char local_68 [80];
  
  local_70 = in_RDI;
  wVar2 = pack_slots_used(player);
  if ((int)(uint)z_info->pack_size < wVar2) {
    disturb(player);
    msg("Your pack overflows!");
    uVar1 = z_info->pack_size;
    if (uVar1 == 0) {
      uVar4 = 1;
    }
    else {
      uVar3 = uVar1 + 1;
      uVar4 = 1;
      do {
        if (player->upkeep->inven[uVar4] == (object *)0x0) {
          uVar3 = (uint)uVar4;
          break;
        }
        bVar6 = uVar4 != (uint)uVar1;
        uVar4 = uVar4 + 1;
      } while (bVar6);
      uVar4 = (ulong)uVar3;
    }
    if ((in_RDI == (object *)0x0) &&
       (in_RDI = player->upkeep->inven[uVar4 - 1], local_70 = in_RDI, in_RDI == (object *)0x0)) {
      __assert_fail("obj != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-gear.c"
                    ,0x56f,"void pack_overflow(struct object *)");
    }
    object_desc(local_68,0x50,in_RDI,0x43,player);
    msg("You drop %s.",local_68);
    gear_excise_object(player,in_RDI);
    grid.x = (player->grid).x;
    grid.y = (player->grid).y;
    drop_near((chunk *)cave,&local_70,L'\0',grid,false,true);
    msg("You no longer have %s.",local_68);
    ppVar5 = player->upkeep;
    if (ppVar5->notice != 0) {
      notice_stuff(player);
      ppVar5 = player->upkeep;
    }
    if (ppVar5->update != 0) {
      update_stuff(player);
      ppVar5 = player->upkeep;
    }
    if (ppVar5->redraw != 0) {
      redraw_stuff(player);
    }
  }
  return;
}

Assistant:

void pack_overflow(struct object *obj)
{
	int i;
	char o_name[80];

	if (!pack_is_overfull()) return;

	/* Disturbing */
	disturb(player);

	/* Warning */
	msg("Your pack overflows!");

	/* Get the last proper item */
	for (i = 1; i <= z_info->pack_size; i++)
		if (!player->upkeep->inven[i])
			break;

	/* Drop the last inventory item unless requested otherwise */
	if (!obj) {
		obj = player->upkeep->inven[i - 1];
	}

	/* Rule out weirdness (like pack full, but inventory empty) */
	assert(obj != NULL);

	/* Describe */
	object_desc(o_name, sizeof(o_name), obj, ODESC_PREFIX | ODESC_FULL,
		player);

	/* Message */
	msg("You drop %s.", o_name);

	/* Excise the object and drop it (carefully) near the player */
	gear_excise_object(player, obj);
	drop_near(cave, &obj, 0, player->grid, false, true);

	/* Describe */
	msg("You no longer have %s.", o_name);

	/* Notice, update, redraw */
	if (player->upkeep->notice) notice_stuff(player);
	if (player->upkeep->update) update_stuff(player);
	if (player->upkeep->redraw) redraw_stuff(player);
}